

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_IPIStream.cpp
# Opt level: O0

ErrorCode PDB::HasValidIPIStream(RawFile *file)

{
  uint32_t uVar1;
  undefined1 local_70 [8];
  StreamHeader header;
  DirectMSFStream stream;
  RawFile *file_local;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            ((DirectMSFStream *)&header.hashAdjBufferOffset,file,4);
  uVar1 = DirectMSFStream::GetSize((DirectMSFStream *)&header.hashAdjBufferOffset);
  if (uVar1 < 0x38) {
    file_local._4_4_ = InvalidStream;
  }
  else {
    DirectMSFStream::ReadAtOffset<PDB::IPI::StreamHeader>
              ((StreamHeader *)local_70,(DirectMSFStream *)&header.hashAdjBufferOffset,0);
    if (local_70._0_4_ == V80) {
      file_local._4_4_ = Success;
    }
    else {
      file_local._4_4_ = UnknownVersion;
    }
  }
  return file_local._4_4_;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidIPIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(IPIStreamIndex);
	if (stream.GetSize() < sizeof(IPI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const IPI::StreamHeader header = stream.ReadAtOffset<IPI::StreamHeader>(0u);
	if (header.version != IPI::StreamHeader::Version::V80)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}